

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O3

void gen_laguerre_ss_root
               (double *x,int order,double alpha,double *dp2,double *p1,double *b,double *c)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  double x_00;
  double local_58;
  double p2;
  double *local_48;
  double local_40;
  double local_38;
  
  p2 = (double)c;
  local_48 = b;
  local_40 = alpha;
  local_38 = r8_epsilon();
  x_00 = *x;
  iVar2 = 9;
  do {
    gen_laguerre_ss_recur(&local_58,dp2,p1,x_00,order,local_40,local_48,(double *)p2);
    dVar1 = *dp2;
    x_00 = *x - local_58 / dVar1;
    *x = x_00;
    bVar3 = iVar2 != 0;
    iVar2 = iVar2 + -1;
    if (ABS(local_58 / dVar1) <= (ABS(x_00) + 1.0) * local_38) {
      return;
    }
  } while (bVar3);
  return;
}

Assistant:

void gen_laguerre_ss_root ( double *x, int order, double alpha, double *dp2, 
  double *p1, double b[], double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    GEN_LAGUERRE_SS_ROOT improves a root of a generalized Laguerre polynomial.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    18 February 2008
//
//  Author:
//
//    Original FORTRAN77 version by Arthur Stroud, Don Secrest.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Arthur Stroud, Don Secrest,
//    Gaussian Quadrature Formulas,
//    Prentice Hall, 1966,
//    LC: QA299.4G3S7.
//
//  Parameters:
//
//    Input/output, double *X, the approximate root, which
//    should be improved on output.
//
//    Input, int ORDER, the order of the polynomial to be computed.
//
//    Input, double ALPHA, the exponent of the X factor.
//
//    Output, double *DP2, the value of L'(ORDER)(X).
//
//    Output, double *P1, the value of L(ORDER-1)(X).
//
//    Input, double B[ORDER], C[ORDER], the recursion coefficients.
//
{
  double d;
  double eps;
  double p2;
  int step;
  int step_max = 10;

  eps = r8_epsilon ( );

  for ( step = 1; step <= step_max; step++ )
  {
    gen_laguerre_ss_recur ( &p2, dp2, p1, *x, order, alpha, b, c );

    d = p2 / ( *dp2 );
    *x = *x - d;

    if ( fabs ( d ) <= eps * ( fabs ( *x ) + 1.0 ) )
    {
      break;
    }
  }

  return;
}